

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsMessageSetDestination(HelicsMessage message,char *dest,HelicsError *err)

{
  Message *pMVar1;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pMVar1 = getMessageObj(message,err);
  if (pMVar1 != (Message *)0x0) {
    if (dest == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_30,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,dest,&local_31);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pMVar1->dest,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void helicsMessageSetDestination(HelicsMessage message, const char* dest, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    mess->dest = AS_STRING(dest);
}